

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mappingExample.cpp
# Opt level: O2

int GetMapping<int>(int mapMe,vector<int,_std::allocator<int>_> *mappings)

{
  reference pvVar1;
  ostream *poVar2;
  value_type vVar3;
  bool bVar4;
  ulong uVar5;
  
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"Mapping range: ");
  for (uVar5 = 0;
      uVar5 < (ulong)((long)(mappings->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(mappings->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar5 = uVar5 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::at(mappings,uVar5);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar1);
    std::operator<<(poVar2," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  bVar4 = true;
  uVar5 = 0;
  vVar3 = mapMe;
  do {
    uVar5 = (ulong)(int)uVar5;
    while( true ) {
      if (((ulong)((long)(mappings->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(mappings->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 2) <= uVar5) || (!bVar4)) {
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,mapMe);
        poVar2 = std::operator<<(poVar2," is mapped to ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,vVar3);
        std::endl<char,std::char_traits<char>>(poVar2);
        return vVar3;
      }
      pvVar1 = std::vector<int,_std::allocator<int>_>::at(mappings,uVar5);
      bVar4 = *pvVar1 < mapMe;
      if (mapMe <= *pvVar1) break;
      uVar5 = uVar5 + 1;
    }
    pvVar1 = std::vector<int,_std::allocator<int>_>::at(mappings,uVar5);
    vVar3 = *pvVar1;
  } while( true );
}

Assistant:

MapType GetMapping(MapType mapMe, vector<MapType> mappings){
   MapType result = mapMe;
   int i;
   bool keepLooking;

   keepLooking = true;

   cout << endl;
   cout << "Mapping range: ";
   for (i = 0; i < mappings.size(); ++i) {
      cout << mappings.at(i) << " ";
   }
   cout << endl;

   i = 0;       // Restart counting
   while ((i < mappings.size()) && keepLooking) {
      if(mapMe <= mappings.at(i)) {
         result = mappings.at(i);
         keepLooking = false;
      }
      else {
         ++i;
      }
   }

   cout << mapMe << " is mapped to " << result << endl;

   return result;
}